

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

StorageClass __thiscall
spirv_cross::Compiler::get_expression_effective_storage_class(Compiler *this,uint32_t ptr)

{
  Variant *pVVar1;
  bool bVar2;
  uint32_t uVar3;
  StorageClass SVar4;
  SPIRVariable *pSVar5;
  SPIRExpression *pSVar6;
  SPIRType *pSVar7;
  size_type sVar8;
  uint local_14;
  
  local_14 = ptr;
  pSVar5 = maybe_get_backing_variable(this,ptr);
  pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  if ((pVVar1[local_14].type == TypeExpression) &&
     (pSVar6 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + local_14),
     pSVar6->access_chain == false)) {
    sVar8 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->forced_temporaries)._M_h,&local_14);
    bVar2 = true;
    if (sVar8 == 0) {
      sVar8 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->forwarded_temporaries)._M_h,&local_14);
      bVar2 = sVar8 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((pSVar5 == (SPIRVariable *)0x0) || (bVar2)) {
    uVar3 = expression_type_id(this,local_14);
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar3);
    SVar4 = pSVar7->storage;
  }
  else {
    if (pSVar5->storage == StorageClassUniform) {
      pSVar7 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar5->super_IVariant).field_0xc);
      bVar2 = ParsedIR::has_decoration
                        (&this->ir,(ID)(pSVar7->super_IVariant).self.id,DecorationBufferBlock);
      if (bVar2) {
        return StorageClassStorageBuffer;
      }
    }
    SVar4 = pSVar5->storage;
  }
  return SVar4;
}

Assistant:

StorageClass Compiler::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}